

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::FunctionLiteral::toString_abi_cxx11_(string *__return_storage_ptr__,FunctionLiteral *this)

{
  size_type sVar1;
  const_reference ppIVar2;
  int local_1a0;
  int i;
  ostringstream local_190 [8];
  ostringstream msg;
  FunctionLiteral *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"define ");
  if (this->header != (Identifier *)0x0) {
    ast::operator<<((ostream *)local_190,this->header);
  }
  std::operator<<((ostream *)local_190,"(");
  local_1a0 = 0;
  while( true ) {
    sVar1 = std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::size
                      (&this->parameters);
    if ((int)sVar1 <= local_1a0) break;
    if (0 < local_1a0) {
      sVar1 = std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::size
                        (&this->parameters);
      if (local_1a0 + 1 <= (int)sVar1) {
        std::operator<<((ostream *)local_190,", ");
      }
    }
    ppIVar2 = std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::operator[]
                        (&this->parameters,(long)local_1a0);
    ast::operator<<((ostream *)local_190,*ppIVar2);
    local_1a0 = local_1a0 + 1;
  }
  std::operator<<((ostream *)local_190,")");
  ast::operator<<((ostream *)local_190,this->body);
  std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::FunctionLiteral::toString() const
{
    std::ostringstream msg;
    msg << "define ";
    if(header != nullptr){
        msg << header;
    }
    msg << "(";
    for(int i{0}; i < (int)parameters.size(); i++){
        if(i > 0 && i+1 <= (int)parameters.size()){
            msg << ", ";
        }
        msg << parameters[i];
    }
    msg << ")";
    msg << body;
    msg << std::endl;
    return msg.str();
}